

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

void bf_unget_uint32_be(bfile_t *bfile,uint32_t data)

{
  uint8_t *puVar1;
  int iVar2;
  int bufpos;
  uchar *buffer;
  uint32_t data_local;
  bfile_t *bfile_local;
  
  puVar1 = bfile->buffer;
  iVar2 = (int)(bfile->pos % (ulong)bfile->buffer_size);
  puVar1[iVar2 + -4] = (uint8_t)(data >> 0x18);
  puVar1[iVar2 + -3] = (uint8_t)(data >> 0x10);
  puVar1[iVar2 + -2] = (uint8_t)(data >> 8);
  puVar1[iVar2 + -1] = (uint8_t)data;
  bfile->pos = bfile->pos - 4;
  return;
}

Assistant:

void
bf_unget_uint32_be(
    bfile_t * bfile,
    uint32_t data )
{
    unsigned char * buffer = bfile->buffer;
    int bufpos = bfile->pos % bfile->buffer_size;
    bufpos -= 4;
    assert( bufpos >= 0 );
    buffer[bufpos] = (data >> 24) & 0xff;
    buffer[bufpos+1] = (data >> 16) & 0xff;
    buffer[bufpos+2] = (data >> 8) & 0xff;
    buffer[bufpos+3] = data & 0xff ;
    bfile->pos -= 4;
}